

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O2

void __thiscall
slang::ast::SFormat::TypeVisitor::
formatArray<std::span<slang::ConstantValue_const,18446744073709551615ul>>
          (TypeVisitor *this,Type *type,
          span<const_slang::ConstantValue,_18446744073709551615UL> *arr)

{
  FormatBuffer *this_00;
  Type *this_01;
  size_t i;
  ulong uVar1;
  long lVar2;
  
  this_01 = Type::getArrayElementType(type);
  this_00 = &this->buffer;
  ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,"\'{","");
  lVar2 = 0;
  for (uVar1 = 0; uVar1 < (arr->_M_extent)._M_extent_value; uVar1 = uVar1 + 1) {
    if (uVar1 != 0) {
      ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,",","");
      if (this->abbreviated == false) {
        ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00," ","");
      }
    }
    Symbol::visit<slang::ast::SFormat::TypeVisitor&,slang::ConstantValue_const&>
              (&this_01->super_Symbol,this,
               (ConstantValue *)
               ((long)&(arr->_M_ptr->value).
                       super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               + lVar2));
    lVar2 = lVar2 + 0x28;
  }
  ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)this_00,"}","");
  return;
}

Assistant:

void formatArray(const Type& type, const T& arr) {
        auto elemType = type.getArrayElementType();
        SLANG_ASSERT(elemType);

        buffer.append("'{");
        for (size_t i = 0; i < arr.size(); i++) {
            if (i != 0) {
                buffer.append(",");
                if (!abbreviated)
                    buffer.append(" ");
            }
            elemType->visit(*this, arr[i]);
        }
        buffer.append("}");
    }